

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

int __thiscall TPZFMatrix<double>::Substitution(TPZFMatrix<double> *this,TPZFMatrix<double> *B)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  bool bVar5;
  char *pcVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  ulong local_58;
  
  if ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix",(char *)0x0
         );
  }
  uVar1 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  uVar2 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  uVar3 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (uVar1 != uVar3) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  if (0 < (long)uVar1) {
    uVar8 = 0;
    do {
      if (0 < (long)uVar2) {
        pdVar7 = this->fElem;
        uVar13 = 0;
        do {
          if (uVar8 != 0) {
            pdVar4 = B->fElem;
            lVar11 = (uVar13 & 0xffffffff) * uVar1;
            dVar15 = pdVar4[lVar11 + uVar8];
            uVar12 = 0;
            do {
              dVar15 = dVar15 - pdVar7[uVar8 + (uVar12 & 0xffffffff) * uVar3] *
                                *(double *)
                                 ((long)pdVar4 + uVar12 * 8 + (uVar13 & 0xffffffff) * uVar1 * 8);
              pdVar4[lVar11 + uVar8] = dVar15;
              uVar12 = uVar12 + 1;
            } while (uVar8 != uVar12);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar2);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
  }
  if (0 < (long)uVar2) {
    local_58 = 0;
    do {
      if (0 < (long)uVar1) {
        lVar9 = ((local_58 & 0xffffffff) * 8 + 8) * uVar1;
        lVar11 = (local_58 & 0xffffffff) * uVar1;
        pdVar7 = this->fElem;
        lVar14 = 0;
        uVar8 = uVar1;
        do {
          uVar13 = uVar8 - 1;
          if ((long)uVar8 < (long)uVar1) {
            pdVar4 = B->fElem;
            dVar15 = pdVar4[lVar11 + uVar13];
            lVar10 = 0;
            do {
              dVar15 = dVar15 - pdVar7[uVar13 + (uint)((int)uVar8 + (int)lVar10) * uVar3] *
                                *(double *)((long)pdVar4 + lVar10 * 8 + lVar9);
              pdVar4[lVar11 + uVar13] = dVar15;
              lVar10 = lVar10 + 1;
            } while (lVar14 != lVar10);
          }
          lVar10 = (uVar13 & 0xffffffff) * uVar3 + uVar13;
          dVar15 = pdVar7[lVar10];
          if ((ABS(dVar15) < 1e-12) &&
             ((pcVar6 = "static::BackSub(SubstitutionLU) <Matrix is singular", dVar15 == 0.0 ||
              (pcVar6 = 
               "static::BackSub(SubstitutionLU) <Matrix is singular even after Power Plus...",
              1e-12 < ABS(B->fElem[lVar11 + uVar13] - dVar15))))) {
            Error(pcVar6 + 8,(char *)0x0);
          }
          pdVar7 = this->fElem;
          B->fElem[lVar11 + uVar13] = B->fElem[lVar11 + uVar13] / pdVar7[lVar10];
          lVar14 = lVar14 + 1;
          lVar9 = lVar9 + -8;
          bVar5 = 1 < (long)uVar8;
          uVar8 = uVar13;
        } while (bVar5);
      }
      local_58 = local_58 + 1;
    } while (local_58 != uVar2);
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const {
#ifdef USING_LAPACK    
	if (this->fDecomposed != ELUPivot) {
		Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
	}
#else
	if(this->fDecomposed != ELU) {
        Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
    }
#endif
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    int64_t row = this->Rows();
    if ( rowb != this->Rows() ) Error( "SubstitutionLU <incompatible dimensions>" );
    
    
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( GETVAL(this, row, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(GETVAL(this, row, i, i)/*GetVal(i, i)*/) > 0.){
                    TVar diff = GETVAL(B, rowb, i, col) - GETVAL(this, row, i, i)/*B->GetVal(i, col) - GetVal(i, i)*/;
                    if (fabs(diff) > 1e-12){
                        Error( "BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/GETVAL(this, row, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
    
}